

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O0

void __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::Required<reflection::Service>
          (FlatBufferBuilderImpl<false> *this,Offset<reflection::Service> table,voffset_t field)

{
  voffset_t vVar1;
  Table *this_00;
  bool ok;
  Table *table_ptr;
  voffset_t field_local;
  FlatBufferBuilderImpl<false> *this_local;
  Offset<reflection::Service> table_local;
  
  this_00 = (Table *)vector_downward<unsigned_int>::data_at(&this->buf_,(ulong)table.o);
  vVar1 = Table::GetOptionalFieldOffset(this_00,field);
  if (vVar1 != 0) {
    return;
  }
  __assert_fail("ok",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/flatbuffer_builder.h"
                ,0x1f1,
                "void flatbuffers::FlatBufferBuilderImpl<>::Required(Offset<T>, voffset_t) [Is64Aware = false, T = reflection::Service]"
               );
}

Assistant:

void Required(Offset<T> table, voffset_t field) {
    auto table_ptr = reinterpret_cast<const Table *>(buf_.data_at(table.o));
    bool ok = table_ptr->GetOptionalFieldOffset(field) != 0;
    // If this fails, the caller will show what field needs to be set.
    FLATBUFFERS_ASSERT(ok);
    (void)ok;
  }